

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

CacheEntry * DBOPL::CacheLookupRateDependent(Bit32u rate)

{
  size_type sVar1;
  reference ppCVar2;
  CacheEntry *entry;
  size_t n;
  size_t i;
  Bit32u rate_local;
  
  n = 0;
  sVar1 = std::vector<DBOPL::CacheEntry_*,_std::allocator<DBOPL::CacheEntry_*>_>::size
                    ((vector<DBOPL::CacheEntry_*,_std::allocator<DBOPL::CacheEntry_*>_> *)
                     (cache + 0x28));
  while( true ) {
    if (sVar1 <= n) {
      return (CacheEntry *)0x0;
    }
    ppCVar2 = std::vector<DBOPL::CacheEntry_*,_std::allocator<DBOPL::CacheEntry_*>_>::operator[]
                        ((vector<DBOPL::CacheEntry_*,_std::allocator<DBOPL::CacheEntry_*>_> *)
                         (cache + 0x28),n);
    if ((*ppCVar2)->rate == rate) break;
    n = n + 1;
  }
  return *ppCVar2;
}

Assistant:

static const CacheEntry *CacheLookupRateDependent( Bit32u rate )
{
	for ( size_t i = 0, n = cache.entries.size(); i < n; ++i ) {
		const CacheEntry *entry = cache.entries[i];
		if (entry->rate == rate)
			return entry;
	}
	return NULL;
}